

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

bool test_SSTable_fileIO(void)

{
  allocator<SSTableDataEntry> *this;
  initializer_list<SSTableDataEntry> __l;
  SSTableHeader *pSVar1;
  SSTableIndex *this_00;
  size_type sVar2;
  reference pvVar3;
  SSTableData *this_01;
  reference pvVar4;
  bool local_2a1;
  SSTableDataEntry *local_250;
  SSTableData *d;
  SSTableIndex *index;
  SSTableHeader *h;
  undefined1 local_1f8 [8];
  SSTable s;
  undefined1 local_190 [8];
  SSTable t;
  SSTableDataEntry local_138;
  SSTableDataEntry local_f8;
  SSTableDataEntry local_b8;
  SSTableDataEntry local_78;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  SSTableData data;
  
  SSTableDataEntry::SSTableDataEntry(&local_138,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_f8,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_b8,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_78,false,0x75998cb,4,"NIMO");
  local_38 = &local_138;
  local_30 = 4;
  this = (allocator<SSTableDataEntry> *)((long)&t.index + 3);
  std::allocator<SSTableDataEntry>::allocator(this);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_28,__l,this);
  std::allocator<SSTableDataEntry>::~allocator((allocator<SSTableDataEntry> *)((long)&t.index + 3));
  local_250 = (SSTableDataEntry *)&local_38;
  do {
    local_250 = local_250 + -1;
    SSTableDataEntry::~SSTableDataEntry(local_250);
  } while (local_250 != &local_138);
  SSTable::SSTable((SSTable *)local_190);
  SSTable::fillData((SSTable *)local_190,(SSTableData *)local_28);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            ((path *)&s.index,(char (*) [10])"testf.bin",auto_format);
  SSTable::writeToDisk((SSTable *)local_190,(path *)&s.index);
  std::filesystem::__cxx11::path::~path((path *)&s.index);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            ((path *)&h,(char (*) [10])"testf.bin",auto_format);
  SSTable::SSTable((SSTable *)local_1f8,(path *)&h);
  std::filesystem::__cxx11::path::~path((path *)&h);
  pSVar1 = SSTable::getHeader((SSTable *)local_1f8);
  if ((((pSVar1->key_min == 1) && (pSVar1->entries_count == 4)) && (pSVar1->key_max == 4)) &&
     (pSVar1->index_offset == 0x99)) {
    this_00 = SSTable::getIndex((SSTable *)local_1f8);
    sVar2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::size(this_00);
    if (sVar2 == 4) {
      pvVar3 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                         (this_00,0);
      if (pvVar3->key == 1) {
        pvVar3 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                           (this_00,0);
        if (pvVar3->offset == 0x20) {
          pvVar3 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                             (this_00,1);
          if (pvVar3->key == 2) {
            pvVar3 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                               (this_00,1);
            if (pvVar3->offset == 0x45) {
              pvVar3 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                                 (this_00,2);
              if (pvVar3->key == 3) {
                pvVar3 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::
                         operator[](this_00,2);
                if (pvVar3->offset == 99) {
                  pvVar3 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::
                           operator[](this_00,3);
                  if (pvVar3->key == 4) {
                    pvVar3 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::
                             operator[](this_00,3);
                    if (pvVar3->offset == 0x7c) {
                      this_01 = SSTable::getAllData((SSTable *)local_1f8);
                      remove("testf.bin");
                      sVar2 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::size
                                        (this_01);
                      local_2a1 = true;
                      if (sVar2 == 4) {
                        pvVar4 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::
                                 operator[](this_01,3);
                        local_2a1 = true;
                        if ((pvVar4->delete_flag & 1U) == 0) {
                          pvVar4 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                                   ::operator[](this_01,3);
                          local_2a1 = true;
                          if (pvVar4->timestamp == 0x75998cb) {
                            pvVar4 = std::
                                     vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::
                                     operator[](this_01,3);
                            local_2a1 = true;
                            if (pvVar4->key == 4) {
                              pvVar4 = std::
                                       vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::
                                       operator[](this_01,3);
                              local_2a1 = std::operator!=(&pvVar4->value,"NIMO");
                            }
                          }
                        }
                      }
                      data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                           (local_2a1 ^ 0xffU) & 1;
                      goto LAB_00105be6;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  }
  else {
    data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  }
LAB_00105be6:
  SSTable::~SSTable((SSTable *)local_1f8);
  SSTable::~SSTable((SSTable *)local_190);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_28);
  return (bool)(data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
}

Assistant:

bool test_SSTable_fileIO() {
    auto data = SSTableData{
            {false, 12345678,   1, "Hello,World!"},
            {false, 123455234,  2, "LLLLL"},
            {true,  1212212211, 3, ""},
            {false, 123312331,  4, "NIMO"}
    };
    auto t = SSTable{};
    t.fillData(data);
    t.writeToDisk("testf.bin");

    auto s = SSTable{"testf.bin"};

    auto *h = s.getHeader();

    if (h->key_min != 1 || h->entries_count != 4 || h->key_max != 4 || h->index_offset != 32 + (25 * 4 + 12 + 5 + 4)) {
        return false;
    }

    auto &index = *s.getIndex();

    if (
            index.size() != 4 ||
            index[0].key != 1 ||
            index[0].offset != 32 ||
            index[1].key != 2 ||
            index[1].offset != 69 ||
            index[2].key != 3 ||
            index[2].offset != 99 ||
            index[3].key != 4 ||
            index[3].offset != 124
            ) {
        return false;
    }
    auto &d = *s.getAllData();

    remove("testf.bin");
    return !(d.size() != 4 || d[3].delete_flag != false || d[3].timestamp != 123312331 || d[3].key != 4 ||
             d[3].value != "NIMO");
}